

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::CalculateNumTiles
               (vector<int,_std::allocator<int>_> *numTiles,int toplevel_size,int size,
               int tile_rounding_mode)

{
  pointer piVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  piVar1 = (numTiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar4 = (long)(numTiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  bVar8 = lVar4 == 0;
  if (!bVar8) {
    uVar5 = lVar4 >> 2;
    uVar6 = 1;
    uVar7 = 0;
    do {
      if ((int)(uVar6 - 1) < 0) {
        iVar2 = -1;
      }
      else {
        bVar3 = (byte)(uVar6 - 1);
        iVar2 = toplevel_size / (1 << (bVar3 & 0x1f));
        iVar2 = (uint)(iVar2 << (bVar3 & 0x1f) < toplevel_size && tile_rounding_mode == 1) + iVar2;
        if (iVar2 < 2) {
          iVar2 = 1;
        }
      }
      if (iVar2 < 0) {
        return bVar8;
      }
      if (-0x80000000 - size < iVar2) {
        return bVar8;
      }
      piVar1[uVar7] = (iVar2 + size + -1) / size;
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
      bVar8 = uVar5 <= uVar7;
    } while (uVar7 < uVar5);
  }
  return bVar8;
}

Assistant:

static bool CalculateNumTiles(std::vector<int>& numTiles,
  int toplevel_size,
  int size,
  int tile_rounding_mode) {
  for (unsigned i = 0; i < numTiles.size(); i++) {
    int l = LevelSize(toplevel_size, int(i), tile_rounding_mode);
    if (l < 0) {
      return false;
    }
    TINYEXR_CHECK_AND_RETURN_C(l <= std::numeric_limits<int>::max() - size + 1, false);

    numTiles[i] = (l + size - 1) / size;
  }
  return true;
}